

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsaz_exp_x2.c
# Opt level: O0

void from_words52(unsigned_long *out,int out_bitsize,unsigned_long *in)

{
  uint64_t *in_RDX;
  int in_ESI;
  uint64_t *in_RDI;
  uint8_t *out_str;
  int out_len;
  int i;
  uint64_t *local_28;
  int local_1c;
  uint64_t *local_18;
  int local_c;
  
  for (local_1c = 0; local_28 = in_RDI, local_18 = in_RDX, local_c = in_ESI,
      local_1c < in_ESI + 0x3f >> 6; local_1c = local_1c + 1) {
    in_RDI[local_1c] = 0;
  }
  for (; 0x67 < local_c; local_c = local_c + -0x68) {
    *local_28 = *local_18;
    *(ulong *)((long)local_28 + 6) = local_18[1] << 4 ^ *(ulong *)((long)local_28 + 6);
    local_28 = (uint64_t *)((long)local_28 + 0xd);
    local_18 = local_18 + 2;
  }
  if (local_c < 0x35) {
    if (local_c != 0) {
      put_digit52((uint8_t *)local_28,local_c + 7 >> 3,*local_18);
    }
  }
  else {
    put_digit52((uint8_t *)local_28,7,*local_18);
    put_digit52((uint8_t *)((long)local_28 + 6),local_c + -0x2d >> 3,
                local_18[1] << 4 | *local_18 >> 0x30);
  }
  return;
}

Assistant:

static void from_words52(BN_ULONG *out, int out_bitsize, const BN_ULONG *in)
{
    int i;
    int out_len = BITS2WORD64_SIZE(out_bitsize);

    assert(out != NULL);
    assert(in != NULL);

    for (i = 0; i < out_len; i++)
        out[i] = 0;

    {
        uint8_t *out_str = (uint8_t *)out;

        for (; out_bitsize >= (2 * DIGIT_SIZE); out_bitsize -= (2 * DIGIT_SIZE), in += 2) {
            (*(uint64_t *)out_str) = in[0];
            out_str += 6;
            (*(uint64_t *)out_str) ^= in[1] << 4;
            out_str += 7;
        }

        if (out_bitsize > DIGIT_SIZE) {
            put_digit52(out_str, 7, in[0]);
            out_str += 6;
            out_bitsize -= DIGIT_SIZE;
            put_digit52(out_str, BITS2WORD8_SIZE(out_bitsize),
                        (in[1] << 4 | in[0] >> 48));
        } else if (out_bitsize) {
            put_digit52(out_str, BITS2WORD8_SIZE(out_bitsize), in[0]);
        }
    }
}